

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M_tree.cpp
# Opt level: O0

Node * __thiscall M_tree::delete_one_leaf(M_tree *this,Node *tail)

{
  Node *local_28;
  Node *up;
  Node *tail_local;
  M_tree *this_local;
  
  local_28 = tail->parent;
  up = tail;
  do {
    if (local_28 == (Node *)0x0) {
      return (Node *)0x0;
    }
    if ((up == local_28->left) && (local_28->right == (Node *)0x0)) {
      if (up != (Node *)0x0) {
        Node::~Node(up);
        operator_delete(up,0x50);
      }
      local_28->left = (Node *)0x0;
    }
    else {
      if ((up != local_28->right) || (local_28->left != (Node *)0x0)) {
        if (up == local_28->left) {
          local_28->left = (Node *)0x0;
        }
        if (up == local_28->right) {
          local_28->right = (Node *)0x0;
        }
        if (up != (Node *)0x0) {
          Node::~Node(up);
          operator_delete(up,0x50);
        }
        return local_28;
      }
      if (up != (Node *)0x0) {
        Node::~Node(up);
        operator_delete(up,0x50);
      }
      local_28->right = (Node *)0x0;
    }
    up = local_28;
    local_28 = local_28->parent;
  } while( true );
}

Assistant:

Node *M_tree::delete_one_leaf(Node *tail) {
    Node* up = tail->parent;
    while(up!=NULL){
        if(tail == up->left && up->right == NULL){
            delete(tail);
            tail = up;
            up->left = NULL;
        }
        else if(tail == up->right && up->left == NULL){
            delete(tail);
            tail = up;
            up->right = NULL;
        }
        else{
            if(tail == up->left){
                up->left = NULL;
            }
            if(tail == up->right){
                up->right = NULL;
            }
            delete(tail);
            return up;
        }
        up = tail->parent;
    }
    return NULL;
}